

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

void dg::vr::RelationsAnalyzer::relateValues
               (vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                *changeLocations,VectorSet<const_llvm::Value_*> *froms,ValueRelations *newGraph,
               Handle placeholder)

{
  Handle h;
  Relations rels;
  pointer ppVVar1;
  HandlePtr pBVar2;
  VectorSet<const_llvm::Value_*> *pVVar3;
  _Base_bitset<1UL> _Var4;
  HandlePtr rt;
  _Rb_tree_node_base *p_Var5;
  pointer ppVVar6;
  ValueRelations *toRels;
  size_t mBorderId;
  V related;
  size_t local_a8;
  key_type local_a0;
  Handle local_98;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *local_90;
  BucketToVals *local_88;
  ValueRelations *local_80;
  Bucket *local_78;
  Handle local_70;
  _Rb_tree_node_base *local_68;
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  local_60;
  
  toRels = &(*(changeLocations->
              super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
              )._M_impl.super__Vector_impl_data._M_start)->relations;
  local_98 = placeholder;
  local_90 = changeLocations;
  pBVar2 = getCorrespondingByContent(toRels,froms);
  local_78 = ((pBVar2->relatedBuckets)._M_elems[10].vec.
              super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_data;
  RelationsGraph<dg::vr::ValueRelations>::getRelated
            ((RelationsMap *)&local_60,&toRels->graph,local_78,(Relations *)&comparative,false);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    local_88 = &newGraph->bucketToVals;
    p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    local_80 = toRels;
    do {
      h = *(Handle *)(p_Var5 + 1);
      rels.bits.super__Base_bitset<1UL>._M_w = (bitset<12UL>)p_Var5[1]._M_parent;
      if ((h->id != local_78->id) ||
         (pVVar3 = ValueRelations::getEqual(toRels,h),
         (pVVar3->vec).super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (pVVar3->vec).super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
         ._M_impl.super__Vector_impl_data._M_finish)) {
        local_70 = h;
        local_68 = p_Var5;
        pVVar3 = ValueRelations::getEqual(toRels,h);
        ppVVar1 = (pVVar3->vec).
                  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        toRels = local_80;
        for (ppVVar6 = (pVVar3->vec).
                       super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; local_80 = toRels,
            ppVVar6 != ppVVar1; ppVVar6 = ppVVar6 + 1) {
          local_a0._M_data = (Bucket *)*ppVVar6;
          _Var4._M_w = (_WordT)getCommonByPointedTo<llvm::Value_const*>
                                         (froms,local_90,(Value **)&local_a0,rels);
          if ((_Base_bitset<1UL>)_Var4._M_w != (_Base_bitset<1UL>)0x0) {
            ValueRelations::set<dg::vr::Bucket,llvm::Value_const*>
                      (newGraph,local_98,(Relations)_Var4._M_w,(Value **)&local_a0);
          }
          toRels = local_80;
        }
        local_a8 = ValueRelations::getBorderId(toRels,local_70);
        p_Var5 = local_68;
        if ((local_a8 != 0xffffffffffffffff) &&
           (_Var4._M_w = (_WordT)getCommonByPointedTo<unsigned_long>(froms,local_90,&local_a8,rels),
           (_Base_bitset<1UL>)_Var4._M_w != (_Base_bitset<1UL>)0x0)) {
          rt = ValueRelations::getBorderH(newGraph,local_a8);
          if (rt == (HandlePtr)0x0) {
            rt = RelationsGraph<dg::vr::ValueRelations>::getBorderBucket(&newGraph->graph,local_a8);
            local_a0._M_data = rt;
            std::
            map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
            ::operator[](local_88,&local_a0);
          }
          ValueRelations::set<dg::vr::Bucket,dg::vr::Bucket>
                    (newGraph,local_98,(Relations)_Var4._M_w,rt);
        }
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  return;
}

Assistant:

void RelationsAnalyzer::relateValues(
        const std::vector<const VRLocation *> &changeLocations,
        const VectorSet<V> &froms, ValueRelations &newGraph,
        Handle placeholder) {
    const ValueRelations &predGraph = changeLocations[0]->relations;
    HandlePtr from = getCorrespondingByContent(predGraph, froms);
    assert(from);
    Handle pointedTo = predGraph.getPointedTo(*from);

    for (auto pair : predGraph.getRelated(pointedTo, comparative)) {
        Handle relatedH = pair.first;
        Relations relations = pair.second;

        assert(predGraph.are(pointedTo, relations, relatedH));

        if (relatedH == pointedTo && !predGraph.getEqual(relatedH).empty())
            continue;

        for (V related : predGraph.getEqual(relatedH)) {
            Relations common = getCommonByPointedTo(froms, changeLocations,
                                                    related, relations);
            if (common.any())
                newGraph.set(placeholder, common, related);
        }

        size_t mBorderId = predGraph.getBorderId(relatedH);
        if (mBorderId != std::string::npos) {
            Relations common = getCommonByPointedTo(froms, changeLocations,
                                                    mBorderId, relations);

            if (common.any()) {
                auto borderH = newGraph.getBorderH(mBorderId);
                if (!borderH)
                    borderH = &newGraph.newBorderBucket(mBorderId);
                newGraph.set(placeholder, common, *borderH);
            }
        }
    }
}